

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_annotation.cpp
# Opt level: O2

bool spvtools::val::anon_unknown_3::DecorationTakesIdParameters(Decoration type)

{
  if (((MaxByteOffsetId < type) || ((0xc00008000000U >> ((ulong)type & 0x3f) & 1) == 0)) &&
     (type != CounterBuffer)) {
    return false;
  }
  return true;
}

Assistant:

bool DecorationTakesIdParameters(spv::Decoration type) {
  switch (type) {
    case spv::Decoration::UniformId:
    case spv::Decoration::AlignmentId:
    case spv::Decoration::MaxByteOffsetId:
    case spv::Decoration::HlslCounterBufferGOOGLE:
      return true;
    default:
      break;
  }
  return false;
}